

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::SubmitExtraFiles(cmCTest *this,char *cfiles)

{
  bool bVar1;
  size_t sVar2;
  VectorOfStrings files;
  ostringstream cmCTestLog_msg;
  VectorOfStrings local_1e8;
  undefined1 local_1c8 [32];
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1a8;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [6];
  ios_base local_120 [264];
  
  if (cfiles == (char *)0x0) {
    bVar1 = true;
  }
  else {
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Submit extra files",0x12);
    std::ios::widen((char)(ostream *)local_190 + (char)*(_func_int **)(local_190._0_8_ + -0x18));
    std::ostream::put((char)local_190);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x708,(char *)local_1c8._0_8_,false);
    if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,
                      (ulong)((long)&(((string *)local_1c8._16_8_)->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    local_190._0_8_ = local_190 + 0x10;
    sVar2 = strlen(cfiles);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,cfiles,cfiles + sVar2);
    cmsys::SystemTools::SplitString(&local_1a8,(string *)local_190,';',false);
    local_1c8._16_8_ =
         local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1c8._8_8_ =
         local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1c8._0_8_ =
         local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_1c8);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1a8);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = true;
    }
    else {
      bVar1 = SubmitExtraFiles(this,&local_1e8);
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1e8);
  }
  return bVar1;
}

Assistant:

bool cmCTest::SubmitExtraFiles(const char* cfiles)
{
  if ( !cfiles )
    {
    return 1;
    }

  VectorOfStrings files;

  cmCTestLog(this, OUTPUT, "Submit extra files" << std::endl);

  files = cmSystemTools::SplitString(cfiles, ';');
  if (files.empty())
    {
    return 1;
    }

  return this->SubmitExtraFiles(files);
}